

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestCase458::run(TestCase458 *this)

{
  TestEnum_9c8e9318b29d9cd3 TVar1;
  bool bVar2;
  uint16_t uVar3;
  uint16_t uVar4;
  int iVar5;
  int iVar6;
  uint index;
  Reader *this_00;
  TestEnum_9c8e9318b29d9cd3 *params_2;
  bool bVar7;
  long lVar8;
  Exception *params_2_00;
  BuilderFor<DynamicEnum> BVar9;
  StringPtr name;
  StringPtr name_00;
  Type expected;
  initializer_list<capnp::DynamicValue::Reader> value;
  StringPtr name_01;
  StringPtr name_02;
  StringPtr name_03;
  TestEnum_9c8e9318b29d9cd3 local_2a0 [2];
  undefined1 local_29c [4];
  DynamicEnum local_298;
  Fault f;
  DebugComparison<unsigned_long,_unsigned_int> _kjCondition_1;
  undefined4 local_238;
  undefined4 local_234;
  Reader local_218;
  anon_union_8_2_eba6ea51_for_Type_5 local_1d0;
  DebugComparison<capnp::schemas::TestEnum_9c8e9318b29d9cd3,_capnp::schemas::TestEnum_9c8e9318b29d9cd3>
  _kjCondition;
  uint local_1a0;
  Builder root;
  Builder local_160;
  MallocMessageBuilder builder;
  
  MallocMessageBuilder::MallocMessageBuilder(&builder,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal((Builder *)&_kjCondition_1,&builder.super_MessageBuilder);
  PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7>::init
            ((PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7> *)&root,
             (EVP_PKEY_CTX *)(schemas::s_a0a8f314b80b63fd + 0x48));
  _kjCondition_1.left = CONCAT44(_kjCondition_1.left._4_4_,9);
  _kjCondition_1.right = 0x6bf0d0;
  _kjCondition_1._12_4_ = 0;
  _kjCondition_1.op.content.ptr = (char *)CONCAT62(_kjCondition_1.op.content.ptr._2_6_,2);
  name.content.size_ = 10;
  name.content.ptr = "enumField";
  DynamicStruct::Builder::set(&root,name,(Reader *)&_kjCondition_1);
  DynamicValue::Reader::~Reader((Reader *)&_kjCondition_1);
  _kjCondition_1.left = CONCAT44(_kjCondition_1.left._4_4_,9);
  _kjCondition_1.right = 0x6bf0d0;
  _kjCondition_1._12_4_ = 0;
  _kjCondition_1.op.content.ptr = (char *)CONCAT62(_kjCondition_1.op.content.ptr._2_6_,1);
  local_218.type = ENUM;
  local_1d0.schema = (RawBrandedSchema *)(schemas::s_9c8e9318b29d9cd3 + 0x48);
  local_218.field_1.floatValue = 3.49502037868098e-317;
  local_218.field_1.enumValue.value = 0;
  name_00.content.size_ = 9;
  name_00.content.ptr = "enumList";
  value._M_len = 2;
  value._M_array = (iterator)&_kjCondition_1;
  DynamicStruct::Builder::set(&root,name_00,value);
  this_00 = &local_218;
  lVar8 = 0;
  do {
    DynamicValue::Reader::~Reader(this_00);
    lVar8 = lVar8 + 0x48;
    this_00 = this_00 + -1;
  } while (lVar8 != 0x90);
  name_01.content.size_ = 10;
  name_01.content.ptr = "enumField";
  DynamicStruct::Builder::get((Builder *)&_kjCondition_1,&root,name_01);
  BVar9 = DynamicValue::Builder::AsImpl<capnp::DynamicEnum,_(capnp::Kind)7>::apply
                    ((Builder *)&_kjCondition_1);
  f.exception = (Exception *)BVar9.schema.super_Schema.raw;
  _kjCondition.right = DynamicEnum::asImpl((DynamicEnum *)&f,0x9c8e9318b29d9cd3);
  _kjCondition.result = _kjCondition.right == BAZ;
  _kjCondition.left = BAZ;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  DynamicValue::Builder::~Builder((Builder *)&_kjCondition_1);
  if ((_kjCondition.result == false) && (kj::_::Debug::minSeverity < 3)) {
    local_298.schema.super_Schema.raw._0_2_ = 2;
    name_02.content.size_ = 10;
    name_02.content.ptr = "enumField";
    DynamicStruct::Builder::get((Builder *)&_kjCondition_1,&root,name_02);
    BVar9 = DynamicValue::Builder::AsImpl<capnp::DynamicEnum,_(capnp::Kind)7>::apply
                      ((Builder *)&_kjCondition_1);
    f.exception = (Exception *)BVar9.schema.super_Schema.raw;
    local_2a0[0] = DynamicEnum::asImpl((DynamicEnum *)&f,0x9c8e9318b29d9cd3);
    kj::_::Debug::
    log<char_const(&)[75],kj::_::DebugComparison<capnp::schemas::TestEnum_9c8e9318b29d9cd3,capnp::schemas::TestEnum_9c8e9318b29d9cd3>&,capnp::schemas::TestEnum_9c8e9318b29d9cd3,capnp::schemas::TestEnum_9c8e9318b29d9cd3>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x1d0,ERROR,
               "\"failed: expected \" \"(TestEnum::BAZ) == (root.get(\\\"enumField\\\").as<TestEnum>())\", _kjCondition, TestEnum::BAZ, root.get(\"enumField\").as<TestEnum>()"
               ,(char (*) [75])
                "failed: expected (TestEnum::BAZ) == (root.get(\"enumField\").as<TestEnum>())",
               &_kjCondition,(TestEnum_9c8e9318b29d9cd3 *)&local_298,local_2a0);
    DynamicValue::Builder::~Builder((Builder *)&_kjCondition_1);
  }
  name_03.content.size_ = 9;
  name_03.content.ptr = "enumList";
  DynamicStruct::Builder::get(&local_160,&root,name_03);
  local_29c = (undefined1  [4])0x1;
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicList> *)&_kjCondition,&local_160);
  _kjCondition_1.left = 2;
  _kjCondition_1.right = local_1a0;
  _kjCondition_1.op.content.ptr = " == ";
  _kjCondition_1.op.content.size_ = 5;
  _kjCondition_1.result = local_1a0 == 2;
  if (!_kjCondition_1.result) {
    local_298.schema.super_Schema.raw = (Schema)(RawBrandedSchema *)0x2;
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_int>&,unsigned_long,unsigned_int>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x23,FAILED,"(expected.size()) == (list.size())",
               "_kjCondition,expected.size(), list.size()",&_kjCondition_1,
               (unsigned_long *)&local_298,(uint *)local_2a0);
    kj::_::Debug::Fault::fatal(&f);
  }
  index = 0;
  params_2_00 = (Exception *)local_29c;
  bVar2 = true;
  do {
    bVar7 = bVar2;
    DynamicList::Builder::operator[]((Builder *)&_kjCondition_1,(Builder *)&_kjCondition,index);
    BVar9 = DynamicValue::Builder::AsImpl<capnp::DynamicEnum,_(capnp::Kind)7>::apply
                      ((Builder *)&_kjCondition_1);
    local_298.schema = BVar9.schema.super_Schema.raw;
    local_298.value = BVar9.value;
    uVar3 = DynamicEnum::asImpl(&local_298,0x9c8e9318b29d9cd3);
    uVar4 = *(uint16_t *)&(params_2_00->ownFile).content.ptr;
    f.exception = params_2_00;
    DynamicValue::Builder::~Builder((Builder *)&_kjCondition_1);
    if ((uVar4 != uVar3) && (kj::_::Debug::minSeverity < 3)) {
      DynamicList::Builder::operator[]((Builder *)&_kjCondition_1,(Builder *)&_kjCondition,index);
      BVar9 = DynamicValue::Builder::AsImpl<capnp::DynamicEnum,_(capnp::Kind)7>::apply
                        ((Builder *)&_kjCondition_1);
      local_298.schema = BVar9.schema.super_Schema.raw;
      local_298.value = BVar9.value;
      uVar4 = DynamicEnum::asImpl(&local_298,0x9c8e9318b29d9cd3);
      local_2a0[0] = uVar4;
      kj::_::Debug::
      log<char_const(&)[75],kj::_::DebugComparison<capnp::schemas::TestEnum_9c8e9318b29d9cd3_const&,capnp::schemas::TestEnum_9c8e9318b29d9cd3>&,capnp::schemas::TestEnum_9c8e9318b29d9cd3_const&,capnp::schemas::TestEnum_9c8e9318b29d9cd3>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0x25,ERROR,
                 "\"failed: expected \" \"(expected.begin()[i]) == (list[i].template as<Element>())\", _kjCondition, expected.begin()[i], list[i].template as<Element>()"
                 ,(char (*) [75])
                  "failed: expected (expected.begin()[i]) == (list[i].template as<Element>())",
                 (DebugComparison<const_capnp::schemas::TestEnum_9c8e9318b29d9cd3_&,_capnp::schemas::TestEnum_9c8e9318b29d9cd3>
                  *)&f,(TestEnum_9c8e9318b29d9cd3 *)params_2_00,local_2a0);
      DynamicValue::Builder::~Builder((Builder *)&_kjCondition_1);
    }
    index = 1;
    params_2_00 = (Exception *)(local_29c + 2);
    bVar2 = false;
  } while (bVar7);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicList> *)&_kjCondition_1,&local_160);
  expected.field_4.schema = local_1d0.schema;
  expected.baseType = ENUM;
  expected.listDepth = '\0';
  expected.isImplicitParam = false;
  expected.field_3 = (anon_union_2_2_d12d5221_for_Type_3)0x0;
  expected._6_2_ = 0;
  Type::requireUsableAs((Type *)&_kjCondition_1,expected);
  lVar8 = CONCAT71(_kjCondition_1._33_7_,_kjCondition_1.result);
  _kjCondition_1.left = 2;
  _kjCondition_1.right = local_238;
  _kjCondition_1.op.content.ptr = " == ";
  _kjCondition_1.op.content.size_ = 5;
  _kjCondition_1.result = local_238 == 2;
  if (_kjCondition_1.result) {
    iVar6 = 0;
    params_2 = (TestEnum_9c8e9318b29d9cd3 *)local_29c;
    iVar5 = kj::_::Debug::minSeverity;
    bVar2 = true;
    do {
      bVar7 = bVar2;
      TVar1 = *(TestEnum_9c8e9318b29d9cd3 *)(lVar8 + (ulong)((uint)(iVar6 * local_234) >> 3));
      _kjCondition_1.right._0_2_ = TVar1;
      _kjCondition_1.op.content.ptr = " == ";
      _kjCondition_1.result = *params_2 == TVar1;
      _kjCondition_1.op.content.size_ = 5;
      _kjCondition_1.left = (unsigned_long)params_2;
      if ((!_kjCondition_1.result) && (iVar5 < 3)) {
        f.exception._0_2_ = TVar1;
        kj::_::Debug::
        log<char_const(&)[53],kj::_::DebugComparison<capnp::schemas::TestEnum_9c8e9318b29d9cd3_const&,capnp::schemas::TestEnum_9c8e9318b29d9cd3>&,capnp::schemas::TestEnum_9c8e9318b29d9cd3_const&,capnp::schemas::TestEnum_9c8e9318b29d9cd3>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
                   ,0x2b,ERROR,
                   "\"failed: expected \" \"(expected.begin()[i]) == (typed[i])\", _kjCondition, expected.begin()[i], typed[i]"
                   ,(char (*) [53])"failed: expected (expected.begin()[i]) == (typed[i])",
                   (DebugComparison<const_capnp::schemas::TestEnum_9c8e9318b29d9cd3_&,_capnp::schemas::TestEnum_9c8e9318b29d9cd3>
                    *)&_kjCondition_1,params_2,(TestEnum_9c8e9318b29d9cd3 *)&f);
        iVar5 = kj::_::Debug::minSeverity;
      }
      iVar6 = 1;
      params_2 = (TestEnum_9c8e9318b29d9cd3 *)(local_29c + 2);
      bVar2 = false;
    } while (bVar7);
    DynamicValue::Builder::~Builder(&local_160);
    MallocMessageBuilder::~MallocMessageBuilder(&builder);
    return;
  }
  local_298.schema.super_Schema.raw = (Schema)(RawBrandedSchema *)0x2;
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_int>&,unsigned_long,unsigned_int>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
             ,0x29,FAILED,"(expected.size()) == (typed.size())",
             "_kjCondition,expected.size(), typed.size()",&_kjCondition_1,
             (unsigned_long *)&local_298,(uint *)local_2a0);
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

TEST(DynamicApi, SetEnumFromNative) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<DynamicStruct>(Schema::from<TestAllTypes>());

  root.set("enumField", TestEnum::BAZ);
  root.set("enumList", {TestEnum::BAR, TestEnum::FOO});
  EXPECT_EQ(TestEnum::BAZ, root.get("enumField").as<TestEnum>());
  checkList<TestEnum>(root.get("enumList"), {TestEnum::BAR, TestEnum::FOO});
}